

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::interleave<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  void *in_RDX;
  ulong uVar4;
  void *extraout_RDX;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int n;
  Read<int> RVar8;
  Write<int> out;
  vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *__range2;
  type f;
  value_type array;
  Write<int> local_a0;
  Alloc *local_90;
  ulong local_88;
  vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *local_80;
  Write<int> local_78;
  undefined1 local_68 [24];
  Write<int> local_50;
  Write<int> local_40;
  
  puVar3 = *(ulong **)arrays;
  puVar1 = *(ulong **)(arrays + 8);
  if (puVar3 == puVar1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar5 = (ulong)((long)puVar1 - (long)puVar3) >> 4;
    puVar2 = (ulong *)*puVar3;
    if (((ulong)puVar2 & 1) == 0) {
      uVar7 = *puVar2;
    }
    else {
      uVar7 = (ulong)puVar2 >> 3;
    }
    while (n = (int)(uVar7 >> 2), local_80 = arrays, puVar3 != puVar1) {
      puVar2 = (ulong *)*puVar3;
      if (((ulong)puVar2 & 1) == 0) {
        uVar4 = *puVar2;
      }
      else {
        uVar4 = (ulong)puVar2 >> 3;
      }
      puVar3 = puVar3 + 2;
      if ((int)(uVar4 >> 2) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
    }
    std::__cxx11::string::string((string *)local_68,"",(allocator *)&local_40);
    local_90 = (Alloc *)this;
    Write<int>::Write(&local_a0,n * (int)uVar5,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    lVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = uVar5 & 0xffffffff;
    }
    local_88 = uVar5;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      Write<int>::Write(&local_40,(Write<int> *)(*(long *)local_80 + lVar6));
      Write<int>::Write((Write<int> *)local_68,&local_a0);
      local_68._16_4_ = (undefined4)local_88;
      local_68._20_4_ = (undefined4)uVar4;
      Write<int>::Write(&local_50,&local_40);
      parallel_for<Omega_h::interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                (n,(type *)local_68,"interleave");
      interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)local_68);
      Write<int>::~Write(&local_40);
      lVar6 = lVar6 + 0x10;
    }
    Write<int>::Write(&local_78,&local_a0);
    this = (Omega_h *)local_90;
    Read<int>::Read((Read<signed_char> *)local_90,&local_78);
    Write<int>::~Write(&local_78);
    Write<int>::~Write(&local_a0);
    in_RDX = extraout_RDX;
  }
  RVar8.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}